

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O0

void __thiscall BiquadFilter::SetupLowpass(BiquadFilter *this,float cutoff,float samplerate,float Q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float inv_a0;
  float a0;
  float alpha;
  float w0;
  float Q_local;
  float samplerate_local;
  float cutoff_local;
  BiquadFilter *this_local;
  
  fVar1 = (cutoff * 6.2831855) / samplerate;
  fVar2 = sinf(fVar1);
  fVar2 = fVar2 / (Q * 2.0);
  fVar3 = cosf(fVar1);
  this->b0 = (1.0 - fVar3) * 0.5;
  fVar3 = cosf(fVar1);
  this->b1 = 1.0 - fVar3;
  fVar3 = cosf(fVar1);
  this->b2 = (1.0 - fVar3) * 0.5;
  fVar1 = cosf(fVar1);
  this->a1 = fVar1 * -2.0;
  this->a2 = 1.0 - fVar2;
  fVar1 = 1.0 / (fVar2 + 1.0);
  this->a1 = fVar1 * this->a1;
  this->a2 = fVar1 * this->a2;
  this->b0 = fVar1 * this->b0;
  this->b1 = fVar1 * this->b1;
  this->b2 = fVar1 * this->b2;
  return;
}

Assistant:

void BiquadFilter::SetupLowpass(float cutoff, float samplerate, float Q)
{
    float w0 = 2.0f * kPI * cutoff / samplerate, alpha = sinf(w0) / (2.0f * Q), a0;
    b0 =  (1.0f - cosf(w0)) * 0.5f;
    b1 =   1.0f - cosf(w0);
    b2 =  (1.0f - cosf(w0)) * 0.5f;
    a0 =   1.0f + alpha;
    a1 =  -2.0f * cosf(w0);
    a2 =   1.0f - alpha;
    float inv_a0 = 1.0f / a0; a1 *= inv_a0; a2 *= inv_a0; b0 *= inv_a0; b1 *= inv_a0; b2 *= inv_a0;
}